

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::make<std::pair<cs_impl::any,cs_impl::any>,cs_impl::any,cs_impl::any>
              (any *args,any *args_1)

{
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *args_00;
  proxy *dat;
  proxy *in_RDI;
  proxy *args_1_00;
  any *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  
  uVar1 = 1;
  args_1_00 = in_RDI;
  args_00 = cs::
            allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
            ::alloc<cs_impl::any,cs_impl::any>
                      ((allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>,_64UL,_cs_impl::default_allocator_provider>
                        *)CONCAT44(1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
                       (any *)in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>*>
                  ((allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider>
                    *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),(int *)args_00,
                   (holder<std::pair<cs_impl::any,_cs_impl::any>_> **)args_1_00);
  any((any *)in_RDI,dat);
  return (any)args_1_00;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}